

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,ScopedStmtBlock *stmt)

{
  Generator *pGVar1;
  Stmt *local_18;
  
  if ((stmt->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(stmt->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    local_18 = (Stmt *)stmt;
    pGVar1 = Stmt::generator_parent((Stmt *)stmt);
    if (pGVar1->debug == true) {
      std::vector<kratos::Stmt_const*,std::allocator<kratos::Stmt_const*>>::
      emplace_back<kratos::Stmt*&>
                ((vector<kratos::Stmt_const*,std::allocator<kratos::Stmt_const*>> *)&this->stmts_,
                 &local_18);
    }
  }
  return;
}

Assistant:

void visit(ScopedStmtBlock *stmt) override { process_stmt(stmt); }